

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

uint32_t lzma_mf_hc4_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint32_t uVar1;
  uint32_t cur_match;
  uint8_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  lzma_match *plVar5;
  uint uVar6;
  uint32_t pos;
  uint len_limit;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar4 = mf->read_pos;
  uVar6 = mf->write_pos - uVar4;
  len_limit = mf->nice_len;
  if ((uVar6 < mf->nice_len) && (len_limit = uVar6, uVar6 < 4)) {
    if (mf->action != LZMA_RUN) {
      move_pending(mf);
      return 0;
    }
    __assert_fail("mf->action != LZMA_RUN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                  ,0x18a,"uint32_t lzma_mf_hc4_find(lzma_mf *, lzma_match *)");
  }
  puVar2 = mf->buffer;
  puVar3 = mf->hash;
  cur = puVar2 + uVar4;
  pos = mf->offset + uVar4;
  uVar8 = (uint)puVar2[(ulong)uVar4 + 1] ^ lzma_crc32_table[0][puVar2[uVar4]];
  uVar7 = (uint)puVar2[(ulong)uVar4 + 2] << 8 ^ uVar8;
  uVar8 = uVar8 & 0x3ff;
  uVar10 = (ulong)(uVar7 & 0xffff);
  uVar9 = puVar3[uVar8];
  uVar6 = pos - uVar9;
  uVar1 = puVar3[uVar10 + 0x400];
  uVar4 = ((lzma_crc32_table[0][puVar2[(ulong)uVar4 + 3]] << 5 ^ uVar7) & mf->hash_mask) + 0x10400;
  cur_match = puVar3[uVar4];
  puVar3[uVar8] = pos;
  puVar3[uVar10 + 0x400] = pos;
  puVar3[uVar4] = pos;
  uVar4 = mf->cyclic_size;
  uVar10 = 0;
  uVar7 = 1;
  if ((uVar6 < uVar4) && (cur[-(ulong)uVar6] == *cur)) {
    matches->len = 2;
    matches->dist = uVar6 - 1;
    uVar10 = 1;
    uVar7 = 2;
  }
  if (((uVar1 != uVar9) && (uVar8 = pos - uVar1, uVar8 < uVar4)) && (cur[-(ulong)uVar8] == *cur)) {
    matches[uVar10].dist = uVar8 - 1;
    uVar7 = 3;
    uVar10 = (ulong)((int)uVar10 + 1);
    uVar6 = uVar8;
  }
  uVar9 = (uint32_t)uVar10;
  if (uVar9 == 0) {
LAB_00475827:
    uVar9 = 3;
    if (3 < uVar7) {
      uVar9 = uVar7;
    }
    plVar5 = hc_find_func(len_limit,pos,cur,cur_match,mf->depth,mf->son,mf->cyclic_pos,uVar4,
                          matches + uVar10,uVar9);
    uVar9 = (uint32_t)((ulong)((long)plVar5 - (long)matches) >> 3);
  }
  else {
    bVar11 = uVar7 == len_limit;
    uVar8 = uVar7;
    if (bVar11) {
LAB_00475867:
      matches[uVar9 - 1].len = uVar8;
    }
    else {
      if (cur[(ulong)uVar7 - (ulong)uVar6] == cur[uVar7]) {
        do {
          bVar11 = len_limit - 1 == uVar7;
          uVar8 = len_limit;
          if (bVar11) goto LAB_00475867;
          uVar7 = uVar7 + 1;
        } while (cur[(ulong)uVar7 - (ulong)uVar6] == cur[uVar7]);
      }
      matches[uVar9 - 1].len = uVar7;
      if (!bVar11) goto LAB_00475827;
    }
    mf->son[mf->cyclic_pos] = cur_match;
  }
  move_pos(mf);
  return uVar9;
}

Assistant:

extern uint32_t
lzma_mf_hc4_find(lzma_mf *mf, lzma_match *matches)
{
	const uint8_t *cur;
	uint32_t pos;
	uint32_t temp, hash_value, hash_2_value, hash_3_value; /* hash_4_calc */
	uint32_t delta2, delta3, cur_match;
	uint32_t len_best = 1;
	uint32_t matches_count = 0;

	header_find(false, 4);

	hash_4_calc();

	delta2 = pos - mf->hash[hash_2_value];
	delta3 = pos - mf->hash[FIX_3_HASH_SIZE + hash_3_value];
	cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

	mf->hash[hash_2_value ] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
	mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = 2;
		matches[0].len = 2;
		matches[0].dist = delta2 - 1;
		matches_count = 1;
	}

	if (delta2 != delta3 && delta3 < mf->cyclic_size
			&& *(cur - delta3) == *cur) {
		len_best = 3;
		matches[matches_count++].dist = delta3 - 1;
		delta2 = delta3;
	}

	if (matches_count != 0) {
		for ( ; len_best != len_limit; ++len_best)
			if (*(cur + len_best - delta2) != cur[len_best])
				break;

		matches[matches_count - 1].len = len_best;

		if (len_best == len_limit) {
			hc_skip();
			return matches_count;
		}
	}

	if (len_best < 3)
		len_best = 3;

	hc_find(len_best);
}